

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.hpp
# Opt level: O0

void __thiscall piksel::BaseApp::BaseApp(BaseApp *this,int width,int height,string *title)

{
  string *title_local;
  int height_local;
  int width_local;
  BaseApp *this_local;
  
  this->_vptr_BaseApp = (_func_int **)&PTR__BaseApp_00236ee8;
  this->width = width;
  this->height = height;
  std::__cxx11::string::string((string *)&this->title,(string *)title);
  this->sboSize = 0x36000;
  Shader::Shader(&this->shader);
  this->postfx_texture = 0;
  Shader::Shader(&this->postfx_shader);
  std::stack<piksel::State,std::deque<piksel::State,std::allocator<piksel::State>>>::
  stack<std::deque<piksel::State,std::allocator<piksel::State>>,void>
            ((stack<piksel::State,std::deque<piksel::State,std::allocator<piksel::State>>> *)
             &this->stateStack);
  std::vector<piksel::ShaderRelevantState,_std::allocator<piksel::ShaderRelevantState>_>::vector
            (&this->shaderRelevantStateVector);
  std::vector<piksel::Shape,_std::allocator<piksel::Shape>_>::vector(&this->shapes);
  this->devicePixelRatio = 1.0;
  return;
}

Assistant:

BaseApp(int width, int height, std::string title)
        : width(width)
        , height(height)
        , title(title)
        , sboSize(1024 * sizeof(State))
        , postfx_texture(0)
        , devicePixelRatio(1.0f) {
    }